

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

mmt_fd_type demmt_get_fdtype(int fd)

{
  mmt_fd_type local_14;
  mmt_fd_type fdtype;
  int fd_local;
  
  local_14 = FDUNK;
  if ((-1 < fd) && (fd < 0x10000)) {
    local_14 = open_files[fd].type;
  }
  if (local_14 == FDUNK) {
    fdtype = undetected_fdtype;
  }
  else {
    fdtype = local_14;
  }
  return fdtype;
}

Assistant:

enum mmt_fd_type demmt_get_fdtype(int fd)
{
	enum mmt_fd_type fdtype = FDUNK;

	if (fd >= 0 && fd < MAX_FD)
		fdtype = open_files[fd].type;

	if (fdtype != FDUNK)
		return fdtype;

	return undetected_fdtype;
}